

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

int ImGui::PlotEx(ImGuiPlotType plot_type,char *label,_func_float_void_ptr_int *values_getter,
                 void *data,int values_count,int values_offset,char *overlay_text,float scale_min,
                 float scale_max,ImVec2 frame_size)

{
  ImVec2 *p;
  ImVec2 IVar1;
  ImGuiWindow *this;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ImU32 IVar5;
  ImGuiContext *pIVar6;
  ImRect IVar7;
  ImVec2 p_max;
  bool bVar8;
  ImGuiID id;
  ImU32 IVar9;
  ImU32 IVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  ImGuiContext *g;
  int iVar14;
  uint uVar15;
  uint uVar16;
  bool bVar17;
  uint uVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar21;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 extraout_var_00 [56];
  undefined1 auVar24 [64];
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 in_XMM2_Qb;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  float fVar35;
  undefined1 auVar36 [12];
  undefined1 in_ZMM7 [64];
  undefined1 local_138 [16];
  undefined1 local_108 [16];
  ImVec2 pos1;
  ImVec2 pos0;
  undefined1 local_b8 [16];
  ImRect inner_bb;
  ImRect frame_bb;
  ImRect total_bb;
  undefined1 extraout_var [60];
  
  pIVar6 = GImGui;
  local_b8._4_4_ = in_XMM0_Db;
  local_b8._0_4_ = scale_min;
  local_b8._8_4_ = in_XMM0_Dc;
  local_b8._12_4_ = in_XMM0_Dd;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    local_138._4_4_ = in_XMM1_Db;
    local_138._0_4_ = scale_max;
    local_138._8_4_ = in_XMM1_Dc;
    local_138._12_4_ = in_XMM1_Dd;
    local_108._8_8_ = in_XMM2_Qb;
    local_108._0_8_ = frame_size;
    id = ImGuiWindow::GetID(this,label,(char *)0x0);
    auVar31._0_8_ = CalcTextSize(label,(char *)0x0,true,-1.0);
    auVar31._8_56_ = extraout_var_00;
    if ((frame_size.x == 0.0) && (!NAN(frame_size.x))) {
      fVar19 = CalcItemWidth();
      local_108._4_12_ = local_108._4_12_;
      local_108._0_4_ = fVar19;
    }
    auVar28 = vmovshdup_avx(local_108);
    if ((auVar28._0_4_ != 0.0) || (NAN(auVar28._0_4_))) {
      fVar19 = (pIVar6->Style).FramePadding.y;
    }
    else {
      fVar19 = (pIVar6->Style).FramePadding.y;
      auVar28 = vmovshdup_avx(auVar31._0_16_);
      auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)fVar19),ZEXT416(0x40000000));
      local_108 = vinsertps_avx(local_108,auVar28,0x10);
    }
    IVar1 = (this->DC).CursorPos;
    auVar25._8_8_ = 0;
    auVar25._0_4_ = IVar1.x;
    auVar25._4_4_ = IVar1.y;
    auVar28 = vinsertps_avx(local_108,auVar28,0x10);
    auVar27._0_4_ = auVar28._0_4_ + IVar1.x;
    auVar27._4_4_ = auVar28._4_4_ + IVar1.y;
    auVar27._8_4_ = auVar28._8_4_ + 0.0;
    auVar27._12_4_ = auVar28._12_4_ + 0.0;
    auVar22 = vmovshdup_avx(auVar25);
    frame_bb = (ImRect)vmovlhps_avx(auVar25,auVar27);
    fVar20 = (pIVar6->Style).FramePadding.x;
    auVar28 = vinsertps_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar19),0x10);
    auVar29 = vsubps_avx(auVar27,auVar28);
    auVar28 = vinsertps_avx(ZEXT416((uint)(fVar20 + IVar1.x)),
                            ZEXT416((uint)(fVar19 + auVar22._0_4_)),0x10);
    inner_bb = (ImRect)vmovlhps_avx(auVar28,auVar29);
    fVar20 = 0.0;
    fVar35 = auVar31._0_4_;
    if (0.0 < fVar35) {
      fVar20 = fVar35 + (pIVar6->Style).ItemInnerSpacing.x;
    }
    auVar28._0_4_ = auVar27._0_4_ + fVar20;
    auVar28._4_4_ = auVar27._4_4_ + 0.0;
    auVar28._8_4_ = auVar27._8_4_ + 0.0;
    auVar28._12_4_ = auVar27._12_4_ + 0.0;
    total_bb = (ImRect)vmovlhps_avx(auVar25,auVar28);
    ItemSize(&total_bb,fVar19);
    bVar8 = ItemAdd(&total_bb,0,&frame_bb,0);
    if (bVar8) {
      bVar8 = ItemHoverable(&frame_bb,id);
      auVar36 = in_ZMM7._4_12_;
      if (((scale_min == 3.4028235e+38) && (!NAN(scale_min))) ||
         ((scale_max == 3.4028235e+38 && (!NAN(scale_max))))) {
        auVar34 = ZEXT464(0x7f7fffff);
        auVar31 = ZEXT464(0xff7fffff);
        uVar13 = 0;
        while( true ) {
          auVar36 = in_ZMM7._4_12_;
          iVar11 = auVar31._0_4_;
          if ((~(values_count >> 0x1f) & values_count) == uVar13) break;
          auVar24._0_4_ = (*values_getter)(data,uVar13);
          auVar24._4_60_ = extraout_var;
          bVar2 = NAN(auVar24._0_4_);
          uVar13 = uVar13 + 1;
          uVar3 = vcmpss_avx512f(auVar24._0_16_,auVar31._0_16_,2);
          bVar17 = (bool)((byte)uVar3 & 1);
          auVar28 = vminss_avx(auVar34._0_16_,auVar24._0_16_);
          auVar31 = ZEXT1664(CONCAT124(extraout_var._0_12_,
                                       (uint)bVar2 * iVar11 +
                                       (uint)!bVar2 *
                                       ((uint)bVar17 * iVar11 + (uint)!bVar17 * (int)auVar24._0_4_))
                            );
          auVar34 = ZEXT1664(CONCAT124(auVar28._4_12_,
                                       (uint)bVar2 * auVar34._0_4_ + (uint)!bVar2 * auVar28._0_4_));
        }
        uVar3 = vcmpss_avx512f(local_b8,SUB6416(ZEXT464(0x7f7fffff),0),0);
        bVar2 = (bool)((byte)uVar3 & 1);
        local_b8._0_4_ = (uint)bVar2 * auVar34._0_4_ + (uint)!bVar2 * (int)scale_min;
        uVar3 = vcmpss_avx512f(local_138,SUB6416(ZEXT464(0x7f7fffff),0),0);
        bVar2 = (bool)((byte)uVar3 & 1);
        local_138._0_4_ = (uint)bVar2 * iVar11 + (uint)!bVar2 * (int)scale_max;
      }
      IVar1 = frame_bb.Min;
      p_max = frame_bb.Max;
      IVar9 = GetColorU32(7,1.0);
      RenderFrame(IVar1,p_max,IVar9,true,(pIVar6->Style).FrameRounding);
      if (values_count < (int)((plot_type == ImGuiPlotType_Lines) + 1)) {
        uVar13 = 0xffffffff;
      }
      else {
        iVar11 = (int)(float)local_108._0_4_;
        if (values_count <= (int)(float)local_108._0_4_) {
          iVar11 = values_count;
        }
        iVar14 = values_count - (uint)(plot_type == ImGuiPlotType_Lines);
        uVar12 = iVar11 - (uint)(plot_type == ImGuiPlotType_Lines);
        uVar13 = 0xffffffff;
        if (bVar8) {
          p = &(pIVar6->IO).MousePos;
          bVar8 = ImRect::Contains(&inner_bb,p);
          if (bVar8) {
            auVar29._0_12_ = ZEXT812(0);
            auVar29._12_4_ = 0;
            auVar22._0_4_ = (p->x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x);
            auVar22._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar28 = vminss_avx(SUB6416(ZEXT464(0x3f7ff972),0),auVar22);
            uVar3 = vcmpss_avx512f(auVar22,auVar29,1);
            uVar13 = (uint)((float)((uint)!(bool)((byte)uVar3 & 1) * auVar28._0_4_) * (float)iVar14)
            ;
            fVar19 = (*values_getter)(data,(int)(values_offset + uVar13) % values_count);
            fVar20 = (*values_getter)(data,(int)(uVar13 + 1 + values_offset) % values_count);
            if (plot_type == ImGuiPlotType_Lines) {
              SetTooltip("%d: %8.4g\n%d: %8.4g",(double)fVar19,(double)fVar20,(ulong)uVar13,
                         (ulong)(uVar13 + 1));
            }
            else if (plot_type == ImGuiPlotType_Histogram) {
              SetTooltip("%d: %8.4g",(double)fVar19,uVar13);
            }
          }
        }
        bVar17 = plot_type != ImGuiPlotType_Lines;
        uVar3 = vcmpss_avx512f(local_b8,local_138,0);
        fVar32 = local_b8._0_4_;
        fVar19 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)(1.0 / (local_138._0_4_ - fVar32)));
        fVar20 = (*values_getter)(data,values_offset % values_count);
        auVar22 = ZEXT416((uint)(fVar19 * (fVar20 - fVar32)));
        auVar28 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar22);
        uVar3 = vcmpss_avx512f(auVar22,ZEXT816(0) << 0x40,1);
        bVar8 = (bool)((byte)uVar3 & 1);
        uVar3 = vcmpss_avx512f(local_b8,ZEXT816(0) << 0x40,1);
        auVar22 = vfmadd213ss_fma(ZEXT416((uint)fVar19),local_b8,SUB6416(ZEXT464(0x3f800000),0));
        auVar33._0_12_ = ZEXT812(0);
        auVar33._12_4_ = 0;
        uVar4 = vcmpss_avx512f(ZEXT416((uint)(fVar32 * local_138._0_4_)),auVar33,1);
        bVar2 = (bool)((byte)uVar4 & 1);
        IVar9 = GetColorU32(bVar17 + 0x26 + (uint)bVar17,1.0);
        IVar10 = GetColorU32(bVar17 + 0x27 + (uint)bVar17,1.0);
        auVar23._0_4_ = (float)iVar14;
        auVar23._4_12_ = auVar36;
        uVar16 = ~((int)uVar12 >> 0x1f) & uVar12;
        auVar28 = vinsertps_avx(auVar23,ZEXT416((uint)bVar8 * 0x3f800000 +
                                                (uint)!bVar8 * (int)(1.0 - auVar28._0_4_)),0x1d);
        while (bVar8 = uVar16 != 0, uVar16 = uVar16 - 1, bVar8) {
          auVar29 = vfmadd213ss_fma(ZEXT416((uint)auVar23._0_4_),auVar28,ZEXT416(0x3f000000));
          uVar15 = (uint)auVar29._0_4_;
          fVar21 = (*values_getter)(data,(int)(values_offset + 1 + uVar15) % values_count);
          IVar7 = inner_bb;
          auVar26._8_8_ = 0;
          auVar26._0_4_ = inner_bb.Min.x;
          auVar26._4_4_ = inner_bb.Min.y;
          inner_bb.Max = IVar7.Max;
          auVar30._8_8_ = 0;
          auVar30._0_4_ = inner_bb.Max.x;
          auVar30._4_4_ = inner_bb.Max.y;
          fVar20 = auVar28._0_4_ + 1.0 / (float)(int)uVar12;
          auVar29 = vsubps_avx(auVar30,auVar26);
          auVar25 = vfmadd213ps_fma(auVar28,auVar29,auVar26);
          auVar27 = ZEXT416((uint)((fVar21 - fVar32) * fVar19));
          auVar28 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar27);
          pos0 = (ImVec2)vmovlps_avx(auVar25);
          uVar4 = vcmpss_avx512f(auVar27,ZEXT416(0),1);
          bVar8 = (bool)((byte)uVar4 & 1);
          uVar18 = (uint)bVar8 * 0x3f800000 + (uint)!bVar8 * (int)(1.0 - auVar28._0_4_);
          bVar8 = plot_type == ImGuiPlotType_Lines;
          auVar28 = vinsertps_avx(ZEXT416((uint)fVar20),
                                  ZEXT416(bVar8 * uVar18 +
                                          (uint)!bVar8 *
                                          ((uint)bVar2 * auVar22._0_4_ +
                                          (uint)!bVar2 * (uint)!(bool)((byte)uVar3 & 1) * 0x3f800000
                                          )),0x10);
          auVar28 = vfmadd213ps_fma(auVar28,auVar29,auVar26);
          pos1 = (ImVec2)vmovlps_avx(auVar28);
          inner_bb = IVar7;
          if (bVar8) {
            IVar5 = IVar9;
            if (uVar13 == uVar15) {
              IVar5 = IVar10;
            }
            ImDrawList::AddLine(this->DrawList,&pos0,&pos1,IVar5,1.0);
          }
          else if (plot_type == ImGuiPlotType_Histogram) {
            if (auVar25._0_4_ + 2.0 <= auVar28._0_4_) {
              pos1.x = auVar28._0_4_ + -1.0;
            }
            IVar5 = IVar9;
            if (uVar13 == uVar15) {
              IVar5 = IVar10;
            }
            ImDrawList::AddRectFilled(this->DrawList,&pos0,&pos1,IVar5,0.0,0);
          }
          auVar28 = vinsertps_avx(ZEXT416((uint)fVar20),ZEXT416(uVar18),0x10);
        }
      }
      if (overlay_text != (char *)0x0) {
        pos0.y = frame_bb.Min.y + (pIVar6->Style).FramePadding.y;
        pos0.x = frame_bb.Min.x;
        pos1 = (ImVec2)vmovlps_avx(SUB6416(ZEXT464(0x3f000000),0));
        RenderTextClipped(&pos0,&frame_bb.Max,overlay_text,(char *)0x0,(ImVec2 *)0x0,&pos1,
                          (ImRect *)0x0);
      }
      if (fVar35 <= 0.0) {
        return uVar13;
      }
      auVar28 = vinsertps_avx(ZEXT416((uint)(frame_bb.Max.x + (pIVar6->Style).ItemInnerSpacing.x)),
                              ZEXT416((uint)inner_bb.Min.y),0x10);
      RenderText(auVar28._0_8_,label,(char *)0x0,true);
      return uVar13;
    }
  }
  return -1;
}

Assistant:

int ImGui::PlotEx(ImGuiPlotType plot_type, const char* label, float (*values_getter)(void* data, int idx), void* data, int values_count, int values_offset, const char* overlay_text, float scale_min, float scale_max, ImVec2 frame_size)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return -1;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (frame_size.x == 0.0f)
        frame_size.x = CalcItemWidth();
    if (frame_size.y == 0.0f)
        frame_size.y = label_size.y + (style.FramePadding.y * 2);

    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + frame_size);
    const ImRect inner_bb(frame_bb.Min + style.FramePadding, frame_bb.Max - style.FramePadding);
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, 0, &frame_bb))
        return -1;
    const bool hovered = ItemHoverable(frame_bb, id);

    // Determine scale from values if not specified
    if (scale_min == FLT_MAX || scale_max == FLT_MAX)
    {
        float v_min = FLT_MAX;
        float v_max = -FLT_MAX;
        for (int i = 0; i < values_count; i++)
        {
            const float v = values_getter(data, i);
            if (v != v) // Ignore NaN values
                continue;
            v_min = ImMin(v_min, v);
            v_max = ImMax(v_max, v);
        }
        if (scale_min == FLT_MAX)
            scale_min = v_min;
        if (scale_max == FLT_MAX)
            scale_max = v_max;
    }

    RenderFrame(frame_bb.Min, frame_bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);

    const int values_count_min = (plot_type == ImGuiPlotType_Lines) ? 2 : 1;
    int idx_hovered = -1;
    if (values_count >= values_count_min)
    {
        int res_w = ImMin((int)frame_size.x, values_count) + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);
        int item_count = values_count + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);

        // Tooltip on hover
        if (hovered && inner_bb.Contains(g.IO.MousePos))
        {
            const float t = ImClamp((g.IO.MousePos.x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x), 0.0f, 0.9999f);
            const int v_idx = (int)(t * item_count);
            IM_ASSERT(v_idx >= 0 && v_idx < values_count);

            const float v0 = values_getter(data, (v_idx + values_offset) % values_count);
            const float v1 = values_getter(data, (v_idx + 1 + values_offset) % values_count);
            if (plot_type == ImGuiPlotType_Lines)
                SetTooltip("%d: %8.4g\n%d: %8.4g", v_idx, v0, v_idx + 1, v1);
            else if (plot_type == ImGuiPlotType_Histogram)
                SetTooltip("%d: %8.4g", v_idx, v0);
            idx_hovered = v_idx;
        }

        const float t_step = 1.0f / (float)res_w;
        const float inv_scale = (scale_min == scale_max) ? 0.0f : (1.0f / (scale_max - scale_min));

        float v0 = values_getter(data, (0 + values_offset) % values_count);
        float t0 = 0.0f;
        ImVec2 tp0 = ImVec2( t0, 1.0f - ImSaturate((v0 - scale_min) * inv_scale) );                       // Point in the normalized space of our target rectangle
        float histogram_zero_line_t = (scale_min * scale_max < 0.0f) ? (1 + scale_min * inv_scale) : (scale_min < 0.0f ? 0.0f : 1.0f);   // Where does the zero line stands

        const ImU32 col_base = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLines : ImGuiCol_PlotHistogram);
        const ImU32 col_hovered = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLinesHovered : ImGuiCol_PlotHistogramHovered);

        for (int n = 0; n < res_w; n++)
        {
            const float t1 = t0 + t_step;
            const int v1_idx = (int)(t0 * item_count + 0.5f);
            IM_ASSERT(v1_idx >= 0 && v1_idx < values_count);
            const float v1 = values_getter(data, (v1_idx + values_offset + 1) % values_count);
            const ImVec2 tp1 = ImVec2( t1, 1.0f - ImSaturate((v1 - scale_min) * inv_scale) );

            // NB: Draw calls are merged together by the DrawList system. Still, we should render our batch are lower level to save a bit of CPU.
            ImVec2 pos0 = ImLerp(inner_bb.Min, inner_bb.Max, tp0);
            ImVec2 pos1 = ImLerp(inner_bb.Min, inner_bb.Max, (plot_type == ImGuiPlotType_Lines) ? tp1 : ImVec2(tp1.x, histogram_zero_line_t));
            if (plot_type == ImGuiPlotType_Lines)
            {
                window->DrawList->AddLine(pos0, pos1, idx_hovered == v1_idx ? col_hovered : col_base);
            }
            else if (plot_type == ImGuiPlotType_Histogram)
            {
                if (pos1.x >= pos0.x + 2.0f)
                    pos1.x -= 1.0f;
                window->DrawList->AddRectFilled(pos0, pos1, idx_hovered == v1_idx ? col_hovered : col_base);
            }

            t0 = t1;
            tp0 = tp1;
        }
    }

    // Text overlay
    if (overlay_text)
        RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, overlay_text, NULL, NULL, ImVec2(0.5f, 0.0f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, inner_bb.Min.y), label);

    // Return hovered index or -1 if none are hovered.
    // This is currently not exposed in the public API because we need a larger redesign of the whole thing, but in the short-term we are making it available in PlotEx().
    return idx_hovered;
}